

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

bool __thiscall glslang::TArraySizes::sameInnerArrayness(TArraySizes *this,TArraySizes *rhs)

{
  TVector<glslang::TArraySize> *pTVar1;
  uint uVar2;
  uint uVar3;
  TIntermTyped *pTVar4;
  TIntermTyped *pTVar5;
  int iVar6;
  int d;
  int iVar7;
  bool bVar8;
  
  pTVar1 = (this->sizes).sizes;
  iVar7 = 0;
  iVar6 = 0;
  if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
    iVar6 = (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  pTVar1 = (rhs->sizes).sizes;
  if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
    iVar7 = (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  if (iVar6 == iVar7) {
    iVar7 = 1;
    do {
      pTVar1 = (this->sizes).sizes;
      if (pTVar1 == (TVector<glslang::TArraySize> *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = (int)((ulong)((long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      bVar8 = iVar6 <= iVar7;
      if (iVar6 <= iVar7) {
        return bVar8;
      }
      uVar2 = TSmallArrayVector::getDimSize(&this->sizes,iVar7);
      uVar3 = TSmallArrayVector::getDimSize(&rhs->sizes,iVar7);
      if (uVar2 != uVar3) {
        return bVar8;
      }
      pTVar4 = TSmallArrayVector::getDimNode(&this->sizes,iVar7);
      pTVar5 = TSmallArrayVector::getDimNode(&rhs->sizes,iVar7);
      iVar7 = iVar7 + 1;
    } while (pTVar4 == pTVar5);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool sameInnerArrayness(const TArraySizes& rhs) const
    {
        if (sizes.size() != rhs.sizes.size())
            return false;

        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimSize(d) != rhs.sizes.getDimSize(d) ||
                sizes.getDimNode(d) != rhs.sizes.getDimNode(d))
                return false;
        }

        return true;
    }